

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.cpp
# Opt level: O2

int __thiscall GenericAssemblerFile::open(GenericAssemblerFile *this,char *__file,int __oflag,...)

{
  Mode MVar1;
  char cVar2;
  bool bVar3;
  error_category *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  path *ppVar5;
  path *p2;
  int iVar6;
  ulong uVar7;
  undefined7 uVar8;
  string sStack_268;
  error_code errorCode;
  error_code ec;
  ofstream temp;
  
  uVar7 = (ulong)__file & 0xffffffff;
  errorCode._M_value = 0;
  peVar4 = (error_category *)std::_V2::system_category();
  this->headerSize = this->originalHeaderSize;
  this->virtualAddress = this->originalHeaderSize;
  uVar8 = (undefined7)(uVar7 >> 8);
  errorCode._M_cat = peVar4;
  if ((int)__file == 0) {
    MVar1 = this->mode;
    if (MVar1 == Copy) {
      ppVar5 = &this->fileName;
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&errorCode;
      bVar3 = ghc::filesystem::copy_file
                        (&this->originalName,ppVar5,overwrite_existing,(error_code *)args);
      if (bVar3) {
        ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                  (&this->stream,(char *)ppVar5,0x1c);
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 != '\0') {
          return (int)CONCAT71(uVar8,1);
        }
        ghc::filesystem::path::u8string_abi_cxx11_((string *)&temp,ppVar5);
        Logger::printError<std::__cxx11::string>((Logger *)0x2,0x177608,(char *)&temp,args);
      }
      else {
        ghc::filesystem::path::u8string_abi_cxx11_((string *)&temp,&this->originalName);
        Logger::printError<std::__cxx11::string>((Logger *)0x2,0x177621,(char *)&temp,args);
      }
LAB_00138e02:
      std::__cxx11::string::~string((string *)&temp);
      return 0;
    }
    if (MVar1 == Create) {
      ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                (&this->stream,(char *)&this->fileName,0x34);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        return (int)CONCAT71(uVar8,1);
      }
      ghc::filesystem::path::u8string_abi_cxx11_((string *)&temp,&this->fileName);
      Logger::printError<std::__cxx11::string>((Logger *)0x2,0x177608,(char *)&temp,in_RCX);
      goto LAB_00138e02;
    }
    if (MVar1 == Open) {
      ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                (&this->stream,(char *)&this->fileName,0x1c);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        return (int)CONCAT71(uVar8,1);
      }
      ghc::filesystem::path::u8string_abi_cxx11_((string *)&temp,&this->fileName);
      Logger::printError<std::__cxx11::string>((Logger *)0x2,0x1775f1,(char *)&temp,in_RCX);
      goto LAB_00138e02;
    }
  }
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::basic_ofstream(&temp);
  MVar1 = this->mode;
  if (MVar1 == Copy) {
    ppVar5 = &this->originalName;
    uVar7 = 0;
    ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open(&temp,(char *)ppVar5,0x1c);
    cVar2 = std::__basic_file<char>::is_open();
    if (cVar2 == '\0') {
      ghc::filesystem::path::u8string_abi_cxx11_(&sStack_268,ppVar5);
      Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x177621,(char *)&sStack_268,in_RCX);
    }
    else {
      std::ofstream::close();
      ec._M_value = 0;
      p2 = &this->fileName;
      ec._M_cat = peVar4;
      bVar3 = ghc::filesystem::equivalent(ppVar5,p2,&ec);
      if (bVar3) {
        ghc::filesystem::path::u8string_abi_cxx11_(&sStack_268,ppVar5);
        Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x177621,(char *)&sStack_268,in_RCX);
      }
      else {
        bVar3 = ghc::filesystem::exists(p2);
        iVar6 = 0x34;
        if (bVar3) {
          iVar6 = 0x1c;
        }
        ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open(&temp,(char *)p2,iVar6)
        ;
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 != '\0') {
          std::ofstream::close();
          goto LAB_00138bfe;
        }
        ghc::filesystem::path::u8string_abi_cxx11_(&sStack_268,p2);
        Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x177608,(char *)&sStack_268,in_RCX);
      }
    }
LAB_00138dca:
    std::__cxx11::string::~string((string *)&sStack_268);
  }
  else {
    if (MVar1 == Create) {
      ppVar5 = &this->fileName;
      bVar3 = ghc::filesystem::exists(ppVar5);
      iVar6 = 0x34;
      if (bVar3) {
        iVar6 = 0x1c;
      }
      ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                (&temp,(char *)ppVar5,iVar6);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        std::ofstream::close();
LAB_00138bfe:
        iVar6 = (int)CONCAT71((int7)(uVar7 >> 8),1);
        if (bVar3 == false) {
          ghc::filesystem::remove((filesystem *)&this->fileName,(char *)&errorCode);
        }
        goto LAB_00138dd4;
      }
      ghc::filesystem::path::u8string_abi_cxx11_(&sStack_268,ppVar5);
      Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x177608,(char *)&sStack_268,in_RCX);
      goto LAB_00138dca;
    }
    if (MVar1 == Open) {
      ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::open
                (&temp,(char *)&this->fileName,0x1c);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        iVar6 = (int)CONCAT71(uVar8,1);
        std::ofstream::close();
        goto LAB_00138dd4;
      }
      ghc::filesystem::path::u8string_abi_cxx11_(&sStack_268,&this->fileName);
      Logger::queueError<std::__cxx11::string>((Logger *)0x2,0x1775f1,(char *)&sStack_268,in_RCX);
      goto LAB_00138dca;
    }
  }
  iVar6 = 0;
LAB_00138dd4:
  ghc::filesystem::basic_ofstream<char,_std::char_traits<char>_>::~basic_ofstream(&temp);
  return iVar6;
}

Assistant:

bool GenericAssemblerFile::open(bool onlyCheck)
{
	std::error_code errorCode;

	headerSize = originalHeaderSize;
	virtualAddress = headerSize;

	auto flagsOpenExisting = fs::ofstream::in | fs::ofstream::out | fs::ofstream::binary;
	auto flagsOverwrite = fs::ofstream::out | fs::ofstream::trunc | fs::ofstream::binary;

	if (!onlyCheck)
	{
		// actually open the file
		switch (mode)
		{
		case Open:
			stream.open(fileName, flagsOpenExisting);
			if (!stream.is_open())
			{
				Logger::printError(Logger::FatalError, "Could not open file %s",fileName.u8string());
				return false;
			}
			return true;

		case Create:
			stream.open(fileName, flagsOverwrite);
			if (!stream.is_open())
			{
				Logger::printError(Logger::FatalError, "Could not create file %s",fileName.u8string());
				return false;
			}
			return true;

		case Copy:
			if (!fs::copy_file(originalName, fileName, fs::copy_options::overwrite_existing, errorCode))
			{
				Logger::printError(Logger::FatalError, "Could not copy file %s",originalName.u8string());
				return false;
			}

			stream.open(fileName, flagsOpenExisting);
			if (!stream.is_open())
			{
				Logger::printError(Logger::FatalError, "Could not create file %s",fileName.u8string());
				return false;
			}
			return true;
		}
	}

	// else only check if it can be done, don't actually do it permanently
	bool exists = false;
	fs::ofstream temp;
	switch (mode)
	{
	case Open:
		temp.open(fileName, flagsOpenExisting);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not open file %s",fileName.u8string());
			return false;
		}
		temp.close();
		return true;

	case Create:
		// open file with writee access. if it didn't exist before, remove it afterwards
		exists = fs::exists(fileName);

		temp.open(fileName, exists ? flagsOpenExisting : flagsOverwrite);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not create file %s",fileName.u8string());
			return false;
		}
		temp.close();

		if (!exists)
			fs::remove(fileName, errorCode);

		return true;

	case Copy:
		// check original file
		temp.open(originalName, flagsOpenExisting);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not copy file %s",originalName.u8string());
			return false;
		}
		temp.close();

		// Check input and output are not the same
		std::error_code ec;
		if (fs::equivalent(originalName, fileName, ec))
		{
			Logger::queueError(Logger::FatalError, "Could not copy file %s", originalName.u8string());
			return false;
		}

		// check new file, same as create
		exists = fs::exists(fileName);

		temp.open(fileName, exists ? flagsOpenExisting : flagsOverwrite);
		if (!temp.is_open())
		{
			Logger::queueError(Logger::FatalError, "Could not create file %s",fileName.u8string());
			return false;
		}
		temp.close();

		if (!exists)
			fs::remove(fileName, errorCode);
		return true;
	}

	return false;
}